

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlignDefault_CeilDefaultAligned_Test::TestBody
          (ArenaAlignDefault_CeilDefaultAligned_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  _func_int **pp_Var5;
  pointer *__ptr;
  DeathTest *pDVar6;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  AssertionResult gtest_ar;
  char p [17];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  gtest_dt = (DeathTest *)p;
  p[0] = '\0';
  p[1] = '\0';
  p[2] = '\0';
  p[3] = '\0';
  p[4] = '\0';
  p[5] = '\0';
  p[6] = '\0';
  p[7] = '\0';
  p[8] = '\0';
  p[9] = '\0';
  p[10] = '\0';
  p[0xb] = '\0';
  p[0xc] = '\0';
  p[0xd] = '\0';
  p[0xe] = '\0';
  p[0xf] = '\0';
  p[0x10] = '\0';
  gtest_sentinel.test_ = gtest_dt;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&gtest_ar,(char *)&gtest_dt,(char **)"align_default.CeilDefaultAligned(p + 0)");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      (*gtest_dt->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_dt = (DeathTest *)(p + 8);
  gtest_sentinel.test_ = gtest_dt;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&gtest_ar,(char *)&gtest_dt,(char **)"align_default.CeilDefaultAligned(p + 8)");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x58,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      (*gtest_dt->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_dt = (DeathTest *)(p + 0x10);
  gtest_sentinel.test_ = gtest_dt;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (&gtest_ar,(char *)&gtest_dt,(char **)"align_default.CeilDefaultAligned(p + 16)");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      (*gtest_dt->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 1)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5b,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    pDVar6 = gtest_dt;
    if (!bVar2) goto LAB_00400634;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
          goto LAB_00400634;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&gtest_ar);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var5 = pDVar6->_vptr_DeathTest;
      goto LAB_0040067d;
    }
  }
  else {
LAB_00400634:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    pDVar6 = (DeathTest *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    if (pDVar6 != (DeathTest *)0x0) {
      pp_Var5 = pDVar6->_vptr_DeathTest;
LAB_0040067d:
      (*pp_Var5[1])(pDVar6);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 7)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_60,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5c,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_60);
    pDVar6 = gtest_dt;
    if (!bVar2) goto LAB_00400760;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
          goto LAB_00400760;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&gtest_ar);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var5 = pDVar6->_vptr_DeathTest;
      goto LAB_004007a9;
    }
  }
  else {
LAB_00400760:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    pDVar6 = (DeathTest *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    if (pDVar6 != (DeathTest *)0x0) {
      pp_Var5 = pDVar6->_vptr_DeathTest;
LAB_004007a9:
      (*pp_Var5[1])(pDVar6);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 9)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5d,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    pDVar6 = gtest_dt;
    if (!bVar2) goto LAB_0040088c;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
          goto LAB_0040088c;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&gtest_ar);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var5 = pDVar6->_vptr_DeathTest;
      goto LAB_004008d5;
    }
  }
  else {
LAB_0040088c:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x5d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    pDVar6 = (DeathTest *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    if (pDVar6 != (DeathTest *)0x0) {
      pp_Var5 = pDVar6->_vptr_DeathTest;
LAB_004008d5:
      (*pp_Var5[1])(pDVar6);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 15)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_90,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5e,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    pDVar6 = gtest_dt;
    if (!bVar2) goto LAB_004009b2;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
          goto LAB_004009b2;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&gtest_ar);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var5 = pDVar6->_vptr_DeathTest;
      goto LAB_004009fb;
    }
  }
  else {
LAB_004009b2:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    pDVar6 = (DeathTest *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    if (pDVar6 != (DeathTest *)0x0) {
      pp_Var5 = pDVar6->_vptr_DeathTest;
LAB_004009fb:
      (*pp_Var5[1])(pDVar6);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("align_default.CeilDefaultAligned(p + 17)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
                       ,0x5f,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    pDVar6 = gtest_dt;
    if (bVar2) {
      if (gtest_dt == (DeathTest *)0x0) {
        return;
      }
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
          goto LAB_00400ad8;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          ArenaAlignDefault::CeilDefaultAligned<char>::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&gtest_ar);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var5 = pDVar6->_vptr_DeathTest;
      goto LAB_00400b21;
    }
  }
LAB_00400ad8:
  testing::Message::Message((Message *)&gtest_ar);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_dt,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
             ,0x5f,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
  pDVar6 = (DeathTest *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  if (pDVar6 == (DeathTest *)0x0) {
    return;
  }
  pp_Var5 = pDVar6->_vptr_DeathTest;
LAB_00400b21:
  (*pp_Var5[1])(pDVar6);
  return;
}

Assistant:

TEST(ArenaAlignDefault, CeilDefaultAligned) {
  alignas(8) char p[17] = {0};
  auto align_default = ArenaAlignDefault();
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 0), Eq(p + 0));
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 8), Eq(p + 8));
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 16), Eq(p + 16));
#if GTEST_HAS_DEATH_TEST
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 1), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 7), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 9), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 15), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 17), ".*");
#endif  // GTEST_HAS_DEATH_TEST
}